

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::SliderPrivate::SliderPrivate(SliderPrivate *this,Slider *parent)

{
  Slider *parent_local;
  SliderPrivate *this_local;
  
  this->q = parent;
  this->radius = 0;
  this->grooveHeight = 2;
  this->pressedControl = SC_None;
  this->clickOffset = 0;
  QColor::QColor(&this->highlightColor);
  return;
}

Assistant:

SliderPrivate( Slider * parent )
		:	q( parent )
		,	radius( 0 )
		,	grooveHeight( 2 )
		,	pressedControl( QStyle::SC_None )
		,	clickOffset( 0 )
	{
	}